

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O2

unsigned_long adios2sys::Directory::GetNumberOfFilesInDirectory(string *name,string *errorMessage)

{
  int *piVar1;
  DIR *__dirp;
  dirent *pdVar2;
  char *pcVar3;
  int __errnum;
  unsigned_long uVar4;
  allocator local_41;
  string local_40 [32];
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  __dirp = opendir((name->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    if (errorMessage == (string *)0x0) {
      return 0;
    }
    __errnum = *piVar1;
  }
  else {
    uVar4 = 0xffffffffffffffff;
    do {
      pdVar2 = readdir(__dirp);
      uVar4 = uVar4 + 1;
    } while (pdVar2 != (dirent *)0x0);
    __errnum = *piVar1;
    if (__errnum == 0) {
      closedir(__dirp);
      return uVar4;
    }
    if (errorMessage == (string *)0x0) {
      return 0;
    }
  }
  pcVar3 = strerror(__errnum);
  std::__cxx11::string::string(local_40,pcVar3,&local_41);
  std::__cxx11::string::operator=((string *)errorMessage,local_40);
  std::__cxx11::string::~string(local_40);
  return 0;
}

Assistant:

unsigned long Directory::GetNumberOfFilesInDirectory(const std::string& name,
                                                     std::string* errorMessage)
{
  errno = 0;
  DIR* dir = opendir(name.c_str());

  if (!dir) {
    if (errorMessage) {
      *errorMessage = std::string(strerror(errno));
    }
    return 0;
  }

  unsigned long count = 0;
  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    count++;
  }
  if (errno != 0) {
    if (errorMessage) {
      *errorMessage = std::string(strerror(errno));
    }
    return false;
  }

  closedir(dir);
  return count;
}